

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_GetPrototype(JSContext *ctx,JSValue obj)

{
  JSValueUnion JVar1;
  JSValue v;
  JSValue obj_00;
  JSValue JVar2;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar3;
  JSObject *p;
  JSValue val;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 uStackY_4c;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_10;
  undefined8 local_8;
  
  if ((int)in_RDX == -1) {
    if (*(short *)((long)in_RSI.ptr + 6) == 0x29) {
      obj_00.tag = (int64_t)in_RSI.ptr;
      obj_00.u.ptr = in_RDI.ptr;
      JVar3 = js_proxy_getPrototypeOf((JSContext *)in_RSI.ptr,obj_00);
      local_40 = JVar3.u;
      local_10 = local_40;
      local_38 = JVar3.tag;
      local_8 = local_38;
    }
    else {
      JVar1 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)in_RSI.ptr + 0x18) + 0x38))->ptr;
      if (JVar1.ptr == (void *)0x0) {
        local_10 = (void *)((ulong)uStackY_4c << 0x20);
        local_8 = 2;
      }
      else {
        v.tag = -1;
        v.u.ptr = JVar1.ptr;
        JVar3 = JS_DupValue((JSContext *)in_RDI.ptr,v);
        local_60 = JVar3.u;
        local_10 = local_60;
        local_58 = JVar3.tag;
        local_8 = local_58;
      }
    }
  }
  else {
    JVar3.tag = in_RDX;
    JVar3.u.ptr = in_RSI.ptr;
    JVar3 = JS_GetPrototypePrimitive((JSContext *)in_RDI.ptr,JVar3);
    JVar3 = JS_DupValue((JSContext *)in_RDI.ptr,JVar3);
    local_80 = JVar3.u;
    local_10 = local_80;
    local_78 = JVar3.tag;
    local_8 = local_78;
  }
  JVar2.tag = local_8;
  JVar2.u.float64 = local_10;
  return JVar2;
}

Assistant:

JSValue JS_GetPrototype(JSContext *ctx, JSValueConst obj)
{
    JSValue val;
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        JSObject *p;
        p = JS_VALUE_GET_OBJ(obj);
        if (unlikely(p->class_id == JS_CLASS_PROXY)) {
            val = js_proxy_getPrototypeOf(ctx, obj);
        } else {
            p = p->shape->proto;
            if (!p)
                val = JS_NULL;
            else
                val = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
        }
    } else {
        val = JS_DupValue(ctx, JS_GetPrototypePrimitive(ctx, obj));
    }
    return val;
}